

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O0

void __thiscall
ktx::ValidationContext::fatal<std::__cxx11::string_const&,std::__cxx11::string>
          (ValidationContext *this,IssueFatal *issue,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  basic_string_view<char,_std::char_traits<char>_> s;
  underlying_type_t<ktx::ReturnCode> uVar1;
  ValidationReport *pVVar2;
  undefined8 uVar3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined1 *in_RSI;
  ValidationReport *in_RDI;
  undefined1 in_stack_00000088 [16];
  string_view in_stack_00000098;
  ValidationReport report;
  ValidationReport *in_stack_fffffffffffffe18;
  function<void_(const_ktx::ValidationReport_&)> *this_00;
  FatalValidationError *this_01;
  ValidationReport *this_02;
  undefined7 in_stack_fffffffffffffe48;
  undefined1 in_stack_fffffffffffffe4f;
  allocator<char> *in_stack_fffffffffffffe50;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe60;
  undefined8 local_168;
  undefined8 local_160;
  undefined1 local_141 [41];
  function<void_(const_ktx::ValidationReport_&)> fStack_118;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined1 *local_e8;
  undefined1 local_d8 [32];
  undefined8 local_b8;
  undefined1 *local_b0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  function<void_(const_ktx::ValidationReport_&)> *local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 *local_60;
  undefined8 *local_58;
  undefined8 *local_50;
  undefined1 *local_38;
  undefined8 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined8 local_18;
  undefined8 *local_10;
  undefined8 *local_8;
  
  *(int *)&(in_RDI->details)._M_string_length = (int)(in_RDI->details)._M_string_length + 1;
  local_f8 = in_RCX;
  local_f0 = in_RDX;
  local_e8 = in_RSI;
  uVar1 = ktx::operator+(SUCCESS);
  *(underlying_type_t<ktx::ReturnCode> *)&(in_RDI->details).field_0x4 = uVar1;
  local_141[1] = *local_e8;
  local_141._3_2_ = *(undefined2 *)(local_e8 + 2);
  this_01 = (FatalValidationError *)(local_141 + 9);
  pVVar2 = (ValidationReport *)(local_e8 + 8);
  this_02 = (ValidationReport *)local_141;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
  this_00 = &fStack_118;
  local_60 = (undefined8 *)(local_e8 + 0x18);
  local_58 = &local_168;
  local_70 = *local_60;
  local_68 = *(undefined8 *)(local_e8 + 0x20);
  s._M_str = (char *)this_01;
  s._M_len = (size_t)in_RDI;
  ::fmt::v10::basic_string_view<char>::
  basic_string_view<std::basic_string_view<char,_std::char_traits<char>_>,_0>
            ((basic_string_view<char> *)this_00,s);
  local_8 = local_60;
  local_88 = local_168;
  uStack_80 = local_160;
  local_90 = local_f0;
  local_98 = local_f8;
  local_50 = &local_88;
  local_78 = this_00;
  ::fmt::v10::
  make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string_const,std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffe4f,in_stack_fffffffffffffe48),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_02);
  local_30 = &local_b8;
  local_38 = local_d8;
  local_18 = 0xdd;
  local_b8 = 0xdd;
  local_28 = local_38;
  local_20 = local_38;
  local_10 = local_30;
  local_b0 = local_38;
  ::fmt::v10::vformat_abi_cxx11_(in_stack_00000098,(format_args)in_stack_00000088);
  std::allocator<char>::~allocator((allocator<char> *)local_141);
  std::function<void_(const_ktx::ValidationReport_&)>::operator()(this_00,in_stack_fffffffffffffe18)
  ;
  uVar3 = __cxa_allocate_exception(0x58);
  ValidationReport::ValidationReport(this_02,pVVar2);
  FatalValidationError::FatalValidationError(this_01,in_RDI);
  __cxa_throw(uVar3,&FatalValidationError::typeinfo,FatalValidationError::~FatalValidationError);
}

Assistant:

void fatal(const IssueFatal& issue, Args&&... args) {
        ++numError;
        returnCode = +rc::INVALID_FILE;
        const auto report = ValidationReport{issue.type, issue.id, std::string{issue.message}, fmt::format(issue.detailsFmt, std::forward<Args>(args)...)};
        callback(report);

        throw FatalValidationError(report);
    }